

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_table_function_info.cpp
# Opt level: O2

unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> __thiscall
duckdb::CreateTableFunctionInfo::GetAlterInfo(CreateTableFunctionInfo *this)

{
  long in_RSI;
  string local_e0;
  string local_c0;
  string local_a0;
  AlterEntryData local_80;
  
  ::std::__cxx11::string::string((string *)&local_a0,(string *)(in_RSI + 0x10));
  ::std::__cxx11::string::string((string *)&local_c0,(string *)(in_RSI + 0x30));
  ::std::__cxx11::string::string((string *)&local_e0,(string *)(in_RSI + 0x128));
  AlterEntryData::AlterEntryData(&local_80,&local_a0,&local_c0,&local_e0,RETURN_NULL);
  make_uniq_base<duckdb::AlterInfo,duckdb::AddTableFunctionOverloadInfo,duckdb::AlterEntryData,duckdb::TableFunctionSet_const&>
            ((duckdb *)this,&local_80,(TableFunctionSet *)(in_RSI + 0x180));
  AlterEntryData::~AlterEntryData(&local_80);
  ::std::__cxx11::string::~string((string *)&local_e0);
  ::std::__cxx11::string::~string((string *)&local_c0);
  ::std::__cxx11::string::~string((string *)&local_a0);
  return (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)
         (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)this;
}

Assistant:

unique_ptr<AlterInfo> CreateTableFunctionInfo::GetAlterInfo() const {
	return make_uniq_base<AlterInfo, AddTableFunctionOverloadInfo>(
	    AlterEntryData(catalog, schema, name, OnEntryNotFound::RETURN_NULL), functions);
}